

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Arc2D(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pParentElement;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_Geometry2D *this_00;
  uint pAttrIdx;
  string *psVar5;
  CX3DImporter_NodeElement *ne;
  allocator<char> local_b5;
  float local_b4;
  float local_b0;
  float local_ac;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  string use;
  string def;
  string an;
  
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  pAttrIdx = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  def.field_2._M_local_buf[0] = '\0';
  use.field_2._M_local_buf[0] = '\0';
  uVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_ac = 1.5707964;
  local_b4 = 0.0;
  local_b0 = 1.0;
  do {
    if (uVar3 == pAttrIdx) {
      if (use._M_string_length == 0) {
        this_00 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
        CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
                  (this_00,ENET_Arc2D,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size = 0;
        tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)&tlist;
        tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)&tlist;
        GeometryHelper_Make_Arc2D(this,local_b4,local_ac,local_b0,10,&tlist);
        GeometryHelper_Extend_PointToLine
                  (this,&tlist,
                   (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(ne + 1));
        ne[1].ID._M_string_length = 2;
        iVar4 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pParentElement = ne;
        if ((char)iVar4 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Arc2D",&local_b5);
          ParseNode_Metadata(this,pParentElement,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_List,&ne);
        std::__cxx11::_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::_M_clear
                  (&tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,&use,ENET_Arc2D,&ne);
        if (!bVar2) {
          Throw_USE_NotFound(this,&use);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,&ne);
      }
      std::__cxx11::string::~string((string *)&use);
      std::__cxx11::string::~string((string *)&def);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),(allocator<char> *)&tlist);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar5 = &def;
LAB_005a2d24:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar5 = &use;
        goto LAB_005a2d24;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (!bVar2) {
        bVar2 = std::operator==(&an,"bboxSize");
        if (!bVar2) {
          bVar2 = std::operator==(&an,"containerField");
          if (!bVar2) {
            bVar2 = std::operator==(&an,"endAngle");
            if (bVar2) {
              local_ac = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              bVar2 = std::operator==(&an,"radius");
              if (bVar2) {
                local_b0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
              }
              else {
                bVar2 = std::operator==(&an,"startAngle");
                if (bVar2) {
                  local_b4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                }
                else {
                  Throw_IncorrectAttr(this,&an);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Arc2D()
{
    std::string def, use;
    float endAngle = AI_MATH_HALF_PI_F;
    float radius = 1;
    float startAngle = 0;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("endAngle", endAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("startAngle", startAngle, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Arc2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Arc2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// create point list of geometry object and convert it to line set.
		std::list<aiVector3D> tlist;

		GeometryHelper_Make_Arc2D(startAngle, endAngle, radius, 10, tlist);///TODO: IME - AI_CONFIG for NumSeg
		GeometryHelper_Extend_PointToLine(tlist, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Arc2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}